

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<true,_false,_false>::move_
          (DaTrie<true,_false,_false> *this,uint32_t node_pos,uint32_t base,Edge *edge,Query *query)

{
  uint uVar1;
  bool bVar2;
  uint32_t uVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  size_t sVar7;
  reference pvVar8;
  byte *pbVar9;
  Edge *in_RCX;
  uint in_EDX;
  uint in_ESI;
  Edge *in_RDI;
  Query *in_R8;
  uint32_t src_child_pos;
  uint8_t src_label;
  uint8_t *__end3;
  uint8_t *__begin3;
  Edge *__range3;
  uint32_t src_base;
  Edge src_edge;
  uint32_t dst_node_pos;
  uint32_t src_node_pos;
  uint8_t label;
  uint8_t *__end2;
  uint8_t *__begin2;
  Edge *__range2;
  uint32_t orig_base;
  DaTrie<true,_false,_false> *in_stack_fffffffffffffe70;
  uint32_t in_stack_fffffffffffffe7c;
  uint in_stack_fffffffffffffe80;
  undefined4 in_stack_fffffffffffffe84;
  byte *local_170;
  Edge local_158;
  uint local_4c;
  uint local_48;
  byte local_41;
  byte *local_40;
  byte *local_38;
  Edge *local_30;
  uint32_t local_24;
  Query *local_20;
  Edge *local_18;
  uint local_10;
  uint local_c;
  
  uVar4 = (ulong)in_ESI;
  local_20 = in_R8;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  sVar5 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::size
                    ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI);
  if (sVar5 <= uVar4) {
    __assert_fail("node_pos < bc_.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x2db,
                  "void ddd::DaTrie<true, false, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_c);
  bVar2 = Bc::is_fixed(pvVar6);
  if (!bVar2) {
    __assert_fail("bc_[node_pos].is_fixed()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x2dc,
                  "void ddd::DaTrie<true, false, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = true, WithNLM = false, Prefix = false]"
                 );
  }
  sVar7 = Edge::size(local_18);
  if (sVar7 != 0) {
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_c);
    local_24 = Bc::base(pvVar6);
    local_30 = local_18;
    local_38 = Edge::begin(local_18);
    local_40 = Edge::end(local_30);
    for (; local_38 != local_40; local_38 = local_38 + 1) {
      local_41 = *local_38;
      local_48 = local_24 ^ local_41;
      local_4c = local_10 ^ local_41;
      fix_((DaTrie<true,_false,_false> *)
           CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c,
           (vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe70);
      pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_48);
      pvVar8 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_4c);
      *pvVar8 = *pvVar6;
      Edge::Edge(&local_158);
      edge_(in_stack_fffffffffffffe70,(uint32_t)(uVar4 >> 0x20),in_RDI,(size_t)pvVar6);
      pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_48);
      uVar3 = Bc::base(pvVar6);
      local_170 = Edge::begin(&local_158);
      pbVar9 = Edge::end(&local_158);
      for (; local_170 != pbVar9; local_170 = local_170 + 1) {
        in_stack_fffffffffffffe84 = CONCAT13(*local_170,(int3)in_stack_fffffffffffffe84);
        in_stack_fffffffffffffe80 = uVar3 ^ *local_170;
        pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                           ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,
                            (ulong)in_stack_fffffffffffffe80);
        Bc::set_check(pvVar6,local_4c);
      }
      unfix_((DaTrie<true,_false,_false> *)
             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),in_stack_fffffffffffffe7c
             ,(vector<ddd::BlockLink,_std::allocator<ddd::BlockLink>_> *)in_stack_fffffffffffffe70);
      uVar1 = local_48;
      uVar3 = Query::node_pos(local_20);
      if (uVar1 == uVar3) {
        Query::set_node_pos(local_20,local_4c);
      }
      Edge::~Edge(&local_158);
    }
    pvVar6 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                       ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)local_c);
    Bc::set_base(pvVar6,local_10);
    return;
  }
  __assert_fail("0 < edge.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                ,0x2dd,
                "void ddd::DaTrie<true, false, false>::move_(uint32_t, uint32_t, const Edge &, Query &) [WithBLM = true, WithNLM = false, Prefix = false]"
               );
}

Assistant:

void move_(uint32_t node_pos, uint32_t base, const Edge& edge, Query& query) {
    assert(node_pos < bc_.size());
    assert(bc_[node_pos].is_fixed());
    assert(0 < edge.size());

    auto orig_base = bc_[node_pos].base();

    for (auto label : edge) {
      auto src_node_pos = orig_base ^label;
      auto dst_node_pos = base ^label;

      fix_(dst_node_pos, blocks_);
      bc_[dst_node_pos] = bc_[src_node_pos];
      if (WithNLM) {
        node_links_[dst_node_pos] = node_links_[src_node_pos];
      }

      Edge src_edge;
      edge_(src_node_pos, src_edge);

      auto src_base = bc_[src_node_pos].base();
      for (auto src_label : src_edge) {
        auto src_child_pos = src_base ^src_label;
        bc_[src_child_pos].set_check(dst_node_pos);
      }

      unfix_(src_node_pos, blocks_);

      if (src_node_pos == query.node_pos()) {
        query.set_node_pos(dst_node_pos);
      }
    }

    bc_[node_pos].set_base(base);
  }